

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  int *piVar1;
  byte bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  size_t checkpoint;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  long *plVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint count;
  long lVar18;
  secp256k1_fe *rzr;
  uint uVar19;
  secp256k1_gej *b;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  secp256k1_ge *psVar24;
  secp256k1_ge *psVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  secp256k1_scalar *psVar30;
  secp256k1_fe *psVar31;
  bool bVar32;
  byte bVar33;
  ulong uStack_190;
  ulong local_180;
  long local_178;
  secp256k1_gej *local_170;
  secp256k1_fe *local_168;
  long local_140;
  secp256k1_gej running_sum;
  
  bVar33 = 0;
  checkpoint = secp256k1_scratch_checkpoint(error_callback,scratch);
  secp256k1_gej_set_infinity(r);
  if (inp_g_sc == (secp256k1_scalar *)0x0 && n_points == 0) {
LAB_0010ebf0:
    iVar7 = 1;
  }
  else {
    lVar18 = n_points * 2 + 2;
    if (n_points < 2) {
      uStack_190 = 1;
    }
    else if (n_points < 5) {
      uStack_190 = 2;
    }
    else if (n_points < 0x15) {
      uStack_190 = 3;
    }
    else if (n_points < 0x3a) {
      uStack_190 = 4;
    }
    else if (n_points < 0x89) {
      uStack_190 = 5;
    }
    else if (n_points < 0xec) {
      uStack_190 = 6;
    }
    else if (n_points < 0x4ed) {
      uStack_190 = 7;
    }
    else if (n_points < 0x1145) {
      uStack_190 = 9;
    }
    else if (n_points < 0x1ec9) {
      uStack_190 = 10;
    }
    else {
      uStack_190 = (ulong)(0xc - (n_points < 0x3eb3));
    }
    p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar18 * 0x58);
    s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar18 * 0x20);
    plVar13 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((plVar13 != (long *)0x0 && s1 != (secp256k1_scalar *)0x0) && p1 != (secp256k1_ge *)0x0) {
      pvVar14 = secp256k1_scratch_alloc(error_callback,scratch,lVar18 * 0x10);
      plVar13[1] = (long)pvVar14;
      uVar28 = (uint)uStack_190;
      count = uVar28 + 1;
      bVar2 = (byte)uStack_190;
      bVar6 = (bVar2 | 0x80) / (byte)count;
      pvVar14 = secp256k1_scratch_alloc(error_callback,scratch,(ulong)bVar6 * lVar18 * 4);
      *plVar13 = (long)pvVar14;
      local_170 = (secp256k1_gej *)
                  secp256k1_scratch_alloc(error_callback,scratch,0x80L << (bVar2 & 0x3f));
      if (((plVar13[1] != 0) && (*plVar13 != 0)) && (local_170 != (secp256k1_gej *)0x0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          local_178 = 0;
        }
        else {
          uVar3 = inp_g_sc->d[0];
          uVar4 = inp_g_sc->d[1];
          uVar5 = inp_g_sc->d[3];
          s1->d[2] = inp_g_sc->d[2];
          s1->d[3] = uVar5;
          s1->d[0] = uVar3;
          s1->d[1] = uVar4;
          psVar24 = &secp256k1_ge_const_g;
          psVar25 = p1;
          for (lVar18 = 0xb; lVar18 != 0; lVar18 = lVar18 + -1) {
            (psVar25->x).n[0] = (psVar24->x).n[0];
            psVar24 = (secp256k1_ge *)((long)psVar24 + ((ulong)bVar33 * -2 + 1) * 8);
            psVar25 = (secp256k1_ge *)((long)psVar25 + (ulong)bVar33 * -0x10 + 8);
          }
          secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
          local_178 = 2;
        }
        psVar30 = (secp256k1_scalar *)((long)s1->d + (ulong)(uint)((int)local_178 << 5));
        psVar24 = p1 + local_178;
        while (bVar32 = n_points != 0, n_points = n_points - 1, bVar32) {
          iVar7 = (*cb)(psVar30,psVar24,cb_offset,cbdata);
          if (iVar7 == 0) goto LAB_0010edd6;
          secp256k1_ecmult_endo_split(psVar30,psVar30 + 1,psVar24,psVar24 + 1);
          local_178 = local_178 + 2;
          psVar30 = psVar30 + 2;
          psVar24 = psVar24 + 2;
          cb_offset = cb_offset + 1;
        }
        iVar7 = -2 << (bVar2 & 0x1f);
        local_140 = 0;
        uVar21 = (CONCAT44(0 << (bVar2 & 0x1f),uVar28) | 0x80) / (ulong)count;
        uVar8 = (int)uVar21 - 1;
        uVar19 = 0x80 - uVar8 * count;
        uVar17 = uStack_190 + 1;
        uVar15 = (uStack_190 + 0x80) / uVar17;
        lVar18 = uVar15 * 4;
        uVar9 = (uVar28 + 0x80) / count - 1;
        for (lVar26 = 0; local_178 != lVar26; lVar26 = lVar26 + 1) {
          psVar30 = s1 + lVar26;
          iVar10 = secp256k1_scalar_is_zero(psVar30);
          if ((iVar10 == 0) && (p1[lVar26].infinity == 0)) {
            lVar23 = plVar13[1];
            *(long *)(lVar23 + 8 + local_140 * 0x10) = lVar26;
            lVar27 = *plVar13;
            iVar10 = secp256k1_scalar_is_zero(psVar30);
            if (iVar10 == 0) {
              uVar22 = ~(uint)psVar30->d[0] & 1;
              uVar11 = secp256k1_scalar_get_bits_var(psVar30,0,count);
              *(uint *)(lVar27 + local_140 * (uVar21 & 0xffffffff) * 4) = uVar11 + uVar22;
              lVar27 = lVar18 * local_140 + lVar27;
              lVar20 = 0;
              uVar11 = uVar9 * count;
              for (uVar16 = (ulong)uVar8; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
                uVar12 = count;
                if (lVar20 == 0) {
                  uVar12 = uVar19;
                }
                uVar12 = secp256k1_scalar_get_bits_var(psVar30,uVar11,uVar12);
                if (uVar12 != 0) goto LAB_0010f06a;
                *(undefined4 *)(lVar27 + uVar16 * 4) = 0;
                lVar20 = lVar20 + 1;
                uVar11 = uVar11 + ~uVar28;
              }
              uVar16 = 0;
LAB_0010f06a:
              uVar11 = count;
              for (uVar29 = 1; uVar29 <= ((uint)uVar16 & 0x7fffffff); uVar29 = uVar29 + 1) {
                uVar12 = count;
                if (uVar9 == uVar29) {
                  uVar12 = uVar19;
                }
                uVar12 = secp256k1_scalar_get_bits_var(psVar30,uVar11,uVar12);
                if ((uVar12 & 1) == 0) {
                  piVar1 = (int *)(lVar27 + -4 + uVar29 * 4);
                  *piVar1 = *piVar1 + iVar7;
                  uVar12 = uVar12 | 1;
                }
                *(uint *)(lVar27 + uVar29 * 4) = uVar12;
                if (1 < uVar29) {
                  iVar10 = *(int *)(lVar27 + -4 + uVar29 * 4);
                  if (iVar10 == -1) {
                    iVar10 = *(int *)(lVar27 + -8 + uVar29 * 4);
                    if (0 < iVar10) {
                      iVar10 = iVar10 + iVar7;
                      goto LAB_0010f0e9;
                    }
                  }
                  else if ((iVar10 == 1) &&
                          (iVar10 = *(int *)(lVar27 + -8 + uVar29 * 4), iVar10 < 0)) {
                    iVar10 = iVar10 + (2 << (bVar2 & 0x1f));
LAB_0010f0e9:
                    *(int *)(lVar27 + -8 + uVar29 * 4) = iVar10;
                    *(undefined4 *)(lVar27 + -4 + uVar29 * 4) = 0;
                  }
                }
                uVar11 = uVar11 + count;
              }
            }
            else {
              for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
                *(undefined4 *)(lVar27 + lVar18 * local_140 + uVar16 * 4) = 0;
              }
              uVar22 = 0;
            }
            *(uint *)(lVar23 + local_140 * 0x10) = uVar22;
            local_140 = local_140 + 1;
          }
        }
        secp256k1_gej_set_infinity(r);
        if (local_140 != 0) {
          lVar18 = 1L << (bVar2 & 0x3f);
          local_180 = (uStack_190 | 0x80) / uVar17;
          uVar17 = (uStack_190 + 0x80) / uVar17;
          rzr = (secp256k1_fe *)(uVar17 * 4 + -4);
          local_168 = rzr;
          while (0 < (long)local_180) {
            local_180 = local_180 - 1;
            for (lVar26 = 0; lVar18 << 7 != lVar26; lVar26 = lVar26 + 0x80) {
              secp256k1_gej_set_infinity((secp256k1_gej *)((long)(local_170->x).n + lVar26));
            }
            lVar26 = 8;
            lVar23 = local_140;
            psVar31 = local_168;
            while (bVar32 = lVar23 != 0, lVar23 = lVar23 + -1, uVar21 = uStack_190, bVar32) {
              rzr = (secp256k1_fe *)*plVar13;
              uVar28 = *(uint *)((long)psVar31->n + (long)rzr->n);
              lVar27 = *(long *)(plVar13[1] + lVar26);
              if ((local_180 == 0) && (*(int *)(plVar13[1] + -8 + lVar26) != 0)) {
                secp256k1_ge_neg((secp256k1_ge *)&running_sum,p1 + lVar27);
                rzr = (secp256k1_fe *)0x0;
                secp256k1_gej_add_ge_var
                          (local_170,local_170,(secp256k1_ge *)&running_sum,(secp256k1_fe *)0x0);
              }
              if ((int)uVar28 < 1) {
                if ((int)uVar28 < 0) {
                  uVar28 = ~uVar28;
                  secp256k1_ge_neg((secp256k1_ge *)&running_sum,p1 + lVar27);
                  b = &running_sum;
                  goto LAB_0010f26d;
                }
              }
              else {
                uVar28 = uVar28 - 1;
                b = (secp256k1_gej *)(p1 + lVar27);
LAB_0010f26d:
                rzr = (secp256k1_fe *)0x0;
                secp256k1_gej_add_ge_var
                          (local_170 + (uVar28 >> 1),local_170 + (uVar28 >> 1),(secp256k1_ge *)b,
                           (secp256k1_fe *)0x0);
              }
              lVar26 = lVar26 + 0x10;
              psVar31 = (secp256k1_fe *)((long)psVar31->n + uVar17 * 4);
            }
            while ((int)uVar21 != 0) {
              secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
              uVar21 = (ulong)((int)uVar21 - 1);
            }
            secp256k1_gej_set_infinity(&running_sum);
            lVar26 = lVar18;
            while (1 < lVar26) {
              lVar26 = lVar26 + -1;
              secp256k1_gej_add_var
                        (&running_sum,&running_sum,local_170 + ((uint)lVar26 & 0x7fffffff),rzr);
              secp256k1_gej_add_var(r,r,&running_sum,rzr);
            }
            secp256k1_gej_add_var(&running_sum,&running_sum,local_170,rzr);
            secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
            secp256k1_gej_add_var(r,r,&running_sum,rzr);
            local_168 = (secp256k1_fe *)((long)local_168[-1].n + 0x24);
          }
        }
        lVar18 = 0;
        for (lVar26 = 0; local_178 != lVar26; lVar26 = lVar26 + 1) {
          s1[lVar26].d[2] = 0;
          (s1[lVar26].d + 2)[1] = 0;
          s1[lVar26].d[0] = 0;
          s1[lVar26].d[1] = 0;
          *(undefined4 *)(plVar13[1] + lVar26 * 0x10) = 0;
          lVar23 = *plVar13;
          for (uVar17 = 0; bVar6 != uVar17; uVar17 = uVar17 + 1) {
            *(undefined4 *)(lVar23 + lVar18 + uVar17 * 4) = 0;
          }
          lVar18 = lVar18 + (ulong)bVar6 * 4;
        }
        for (uVar28 = 0; uVar28 >> (bVar2 & 0x1f) == 0; uVar28 = uVar28 + 1) {
          secp256k1_gej_clear(local_170);
          local_170 = local_170 + 1;
        }
        secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
        goto LAB_0010ebf0;
      }
    }
LAB_0010edd6:
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int i, j;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);

    /* Clear data */
    for(i = 0; (size_t)i < idx; i++) {
        secp256k1_scalar_clear(&scalars[i]);
        state_space->ps[i].skew_na = 0;
        for(j = 0; j < WNAF_SIZE(bucket_window+1); j++) {
            state_space->wnaf_na[i * WNAF_SIZE(bucket_window+1) + j] = 0;
        }
    }
    for(i = 0; i < 1<<bucket_window; i++) {
        secp256k1_gej_clear(&buckets[i]);
    }
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}